

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.cpp
# Opt level: O0

void __thiscall
Assimp::TextureTransformStep::PreProcessUVTransform
          (TextureTransformStep *this,STransformVecInfo *info)

{
  float fVar1;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  basic_formatter *this_00;
  Logger *pLVar3;
  float local_3cc;
  float local_3c8;
  float out_2;
  float out_1;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string local_240;
  float local_220;
  int local_21c;
  float out;
  int rounded;
  char szTemp [512];
  STransformVecInfo *info_local;
  TextureTransformStep *this_local;
  
  fVar1 = (info->super_aiUVTransform).mRotation;
  szTemp._504_8_ = info;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_220 = (info->super_aiUVTransform).mRotation;
    local_21c = (int)((info->super_aiUVTransform).mRotation / 6.2831855);
    if (local_21c != 0) {
      local_220 = local_220 + (float)local_21c * -3.1415927;
      pLVar3 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[29]>(&local_3b8,(char (*) [29])"Texture coordinate rotation ");
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_3b8,(float *)(szTemp._504_8_ + 0x10));
      pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar2,(char (*) [23])" can be simplified to ");
      this_00 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar2,&local_220);
      Formatter::basic_formatter::operator_cast_to_string(&local_240,this_00);
      Logger::info(pLVar3,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_3b8);
    }
    if (local_220 < 0.0) {
      local_220 = local_220 + 12.566371;
    }
    *(float *)(szTemp._504_8_ + 0x10) = local_220;
  }
  else {
    local_21c = (int)(info->super_aiUVTransform).mTranslation.x;
    if (local_21c != 0) {
      local_3c8 = 0.0;
      out._0_1_ = '\0';
      if (info->mapU == aiTextureMapMode_Wrap) {
        local_3c8 = (info->super_aiUVTransform).mTranslation.x - (float)local_21c;
        snprintf((char *)&out,0x200,"[w] UV U offset %f can be simplified to %f",
                 (double)(info->super_aiUVTransform).mTranslation.x,(double)local_3c8);
      }
      else if ((info->mapU == aiTextureMapMode_Mirror) && (local_21c != 1)) {
        if (local_21c % 2 != 0) {
          local_21c = local_21c + -1;
        }
        local_3c8 = (info->super_aiUVTransform).mTranslation.x - (float)local_21c;
        snprintf((char *)&out,0x200,"[m/d] UV U offset %f can be simplified to %f",
                 (double)(info->super_aiUVTransform).mTranslation.x,(double)local_3c8);
      }
      else if ((info->mapU == aiTextureMapMode_Clamp) || (info->mapU == aiTextureMapMode_Decal)) {
        snprintf((char *)&out,0x200,"[c] UV U offset %f can be clamped to 1.0f",
                 (double)(info->super_aiUVTransform).mTranslation.x);
        local_3c8 = 1.0;
      }
      if (out._0_1_ != '\0') {
        pLVar3 = DefaultLogger::get();
        Logger::info(pLVar3,(char *)&out);
        *(float *)szTemp._504_8_ = local_3c8;
      }
    }
    local_21c = (int)*(float *)(szTemp._504_8_ + 4);
    if (local_21c != 0) {
      local_3cc = 0.0;
      out._0_1_ = '\0';
      if (*(int *)(szTemp._504_8_ + 0x1c) == 0) {
        local_3cc = *(float *)(szTemp._504_8_ + 4) - (float)local_21c;
        snprintf((char *)&out,0x200,"[w] UV V offset %f can be simplified to %f",
                 (double)*(float *)(szTemp._504_8_ + 4),(double)local_3cc);
      }
      else if ((*(int *)(szTemp._504_8_ + 0x1c) == 2) && (local_21c != 1)) {
        if (local_21c % 2 != 0) {
          local_21c = local_21c + -1;
        }
        local_3cc = *(float *)szTemp._504_8_ - (float)local_21c;
        snprintf((char *)&out,0x200,"[m/d] UV V offset %f can be simplified to %f",
                 (double)*(float *)(szTemp._504_8_ + 4),(double)local_3cc);
      }
      else if ((*(int *)(szTemp._504_8_ + 0x1c) == 1) || (*(int *)(szTemp._504_8_ + 0x1c) == 3)) {
        snprintf((char *)&out,0x200,"[c] UV V offset %f canbe clamped to 1.0f",
                 (double)*(float *)(szTemp._504_8_ + 4));
        local_3cc = 1.0;
      }
      if (out._0_1_ != '\0') {
        pLVar3 = DefaultLogger::get();
        Logger::info(pLVar3,(char *)&out);
        *(float *)(szTemp._504_8_ + 4) = local_3cc;
      }
    }
  }
  return;
}

Assistant:

void TextureTransformStep::PreProcessUVTransform(STransformVecInfo& info)
{
    /*  This function tries to simplify the input UV transformation.
     *  That's very important as it allows us to reduce the number
     *  of output UV channels. The order in which the transformations
     *  are applied is - as always - scaling, rotation, translation.
     */

    char szTemp[512];
    int rounded = 0;


    /* Optimize the rotation angle. That's slightly difficult as
     * we have an inprecise floating-point number (when comparing
     * UV transformations we'll take that into account by using
     * an epsilon of 5 degrees). If there is a rotation value, we can't
     * perform any further optimizations.
     */
    if (info.mRotation)
    {
        float out = info.mRotation;
        if ((rounded = static_cast<int>((info.mRotation / static_cast<float>(AI_MATH_TWO_PI)))))
        {
            out -= rounded * static_cast<float>(AI_MATH_PI);
            ASSIMP_LOG_INFO_F("Texture coordinate rotation ", info.mRotation, " can be simplified to ", out);
        }

        // Next step - convert negative rotation angles to positives
        if (out < 0.f)
            out = (float)AI_MATH_TWO_PI * 2 + out;

        info.mRotation = out;
        return;
    }


    /* Optimize UV translation in the U direction. To determine whether
     * or not we can optimize we need to look at the requested mapping
     * type (e.g. if mirroring is active there IS a difference between
     * offset 2 and 3)
     */
    if ((rounded  = (int)info.mTranslation.x))  {
        float out = 0.0f;
        szTemp[0] = 0;
        if (aiTextureMapMode_Wrap == info.mapU) {
            // Wrap - simple take the fraction of the field
            out = info.mTranslation.x-(float)rounded;
			ai_snprintf(szTemp, 512, "[w] UV U offset %f can be simplified to %f", info.mTranslation.x, out);
        }
        else if (aiTextureMapMode_Mirror == info.mapU && 1 != rounded)  {
            // Mirror
            if (rounded % 2)
                rounded--;
            out = info.mTranslation.x-(float)rounded;

            ai_snprintf(szTemp,512,"[m/d] UV U offset %f can be simplified to %f",info.mTranslation.x,out);
        }
        else if (aiTextureMapMode_Clamp == info.mapU || aiTextureMapMode_Decal == info.mapU)    {
            // Clamp - translations beyond 1,1 are senseless
            ai_snprintf(szTemp,512,"[c] UV U offset %f can be clamped to 1.0f",info.mTranslation.x);

            out = 1.f;
        }
        if (szTemp[0])      {
            ASSIMP_LOG_INFO(szTemp);
            info.mTranslation.x = out;
        }
    }

    /* Optimize UV translation in the V direction. To determine whether
     * or not we can optimize we need to look at the requested mapping
     * type (e.g. if mirroring is active there IS a difference between
     * offset 2 and 3)
     */
    if ((rounded  = (int)info.mTranslation.y))  {
        float out = 0.0f;
        szTemp[0] = 0;
        if (aiTextureMapMode_Wrap == info.mapV) {
            // Wrap - simple take the fraction of the field
            out = info.mTranslation.y-(float)rounded;
            ::ai_snprintf(szTemp,512,"[w] UV V offset %f can be simplified to %f",info.mTranslation.y,out);
        }
        else if (aiTextureMapMode_Mirror == info.mapV  && 1 != rounded) {
            // Mirror
            if (rounded % 2)
                rounded--;
            out = info.mTranslation.x-(float)rounded;

            ::ai_snprintf(szTemp,512,"[m/d] UV V offset %f can be simplified to %f",info.mTranslation.y,out);
        }
        else if (aiTextureMapMode_Clamp == info.mapV || aiTextureMapMode_Decal == info.mapV)    {
            // Clamp - translations beyond 1,1 are senseless
            ::ai_snprintf(szTemp,512,"[c] UV V offset %f canbe clamped to 1.0f",info.mTranslation.y);

            out = 1.f;
        }
        if (szTemp[0])  {
            ASSIMP_LOG_INFO(szTemp);
            info.mTranslation.y = out;
        }
    }
    return;
}